

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall
CommandDrawKeyBar::Parse(CommandDrawKeyBar *this,FScanner *sc,bool fullScreenOffsets)

{
  bool bVar1;
  int iVar2;
  
  FScanner::MustGetToken(sc,0x104);
  this->number = sc->Number;
  FScanner::MustGetToken(sc,0x2c);
  FScanner::MustGetToken(sc,0x101);
  bVar1 = FScanner::Compare(sc,"vertical");
  if (bVar1) {
    this->vertical = true;
  }
  else {
    bVar1 = FScanner::Compare(sc,"horizontal");
    if (!bVar1) {
      FScanner::ScriptError(sc,"Unknown direction \'%s\'.",sc->String);
    }
  }
  FScanner::MustGetToken(sc,0x2c);
  while( true ) {
    bVar1 = FScanner::CheckToken(sc,0x101);
    if (!bVar1) break;
    bVar1 = FScanner::Compare(sc,"reverserows");
    if (bVar1) {
      this->reverseRows = true;
    }
    else {
      bVar1 = FScanner::Compare(sc,"reverse");
      if (bVar1) {
        this->reverse = true;
      }
      else {
        FScanner::ScriptError(sc,"Unknown flag \'%s\'.",sc->String);
      }
    }
    bVar1 = FScanner::CheckToken(sc,0x7c);
    if (!bVar1) {
      FScanner::MustGetToken(sc,0x2c);
    }
  }
  bVar1 = FScanner::CheckToken(sc,0x155);
  if (bVar1) {
    iVar2 = -1;
  }
  else {
    FScanner::MustGetToken(sc,0x104);
    iVar2 = sc->Number;
  }
  this->iconSize = iVar2;
  FScanner::MustGetToken(sc,0x2c);
  SBarInfoCommand::GetCoordinates
            (&this->super_SBarInfoCommand,sc,fullScreenOffsets,&this->x,&this->y);
  bVar1 = FScanner::CheckToken(sc,0x2c);
  if (bVar1) {
    FScanner::MustGetToken(sc,0x104);
    this->keyOffset = sc->Number;
    bVar1 = FScanner::CheckToken(sc,0x2c);
    if (bVar1) {
      FScanner::MustGetToken(sc,0x104);
      this->rowSize = sc->Number;
      FScanner::MustGetToken(sc,0x2c);
      bVar1 = FScanner::CheckToken(sc,0x155);
      if (bVar1) {
        iVar2 = -1;
      }
      else {
        FScanner::MustGetToken(sc,0x104);
        iVar2 = sc->Number;
      }
      this->rowIconSize = iVar2;
    }
  }
  FScanner::MustGetToken(sc,0x3b);
  return;
}

Assistant:

void	Parse(FScanner &sc, bool fullScreenOffsets)
		{
			sc.MustGetToken(TK_IntConst);
			number = sc.Number;
			sc.MustGetToken(',');
			sc.MustGetToken(TK_Identifier);
			if(sc.Compare("vertical"))
				vertical = true;
			else if(!sc.Compare("horizontal"))
				sc.ScriptError("Unknown direction '%s'.", sc.String);
			sc.MustGetToken(',');
			while(sc.CheckToken(TK_Identifier))
			{
				if(sc.Compare("reverserows"))
					reverseRows = true;
				else if(sc.Compare("reverse"))
					reverse = true;
				else
					sc.ScriptError("Unknown flag '%s'.", sc.String);
				if(!sc.CheckToken('|'))
					sc.MustGetToken(',');
			}
			if(sc.CheckToken(TK_Auto))
				iconSize = -1;
			else
			{
				sc.MustGetToken(TK_IntConst);
				iconSize = sc.Number;
			}
			sc.MustGetToken(',');
			GetCoordinates(sc, fullScreenOffsets, x, y);
			if(sc.CheckToken(','))
			{
				//key offset
				sc.MustGetToken(TK_IntConst);
				keyOffset = sc.Number;
				if(sc.CheckToken(','))
				{
					//max per row/column
					sc.MustGetToken(TK_IntConst);
					rowSize = sc.Number;
					sc.MustGetToken(',');
					//row/column spacing (opposite of previous)
					if(sc.CheckToken(TK_Auto))
						rowIconSize = -1;
					else
					{
						sc.MustGetToken(TK_IntConst);
						rowIconSize = sc.Number;
					}
				}
			}
			sc.MustGetToken(';');
		}